

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

int Cec_ManSimCompareEqual(uint *p0,uint *p1,int nWords)

{
  ulong uVar1;
  
  if (((*p1 ^ *p0) & 1) == 0) {
    if (0 < nWords) {
      uVar1 = 0;
      do {
        if (p0[uVar1] != p1[uVar1]) {
          return 0;
        }
        uVar1 = uVar1 + 1;
      } while ((uint)nWords != uVar1);
    }
  }
  else if (0 < nWords) {
    uVar1 = 0;
    do {
      if ((p1[uVar1] ^ p0[uVar1]) != 0xffffffff) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)nWords != uVar1);
  }
  return 1;
}

Assistant:

int Cec_ManSimCompareEqual( unsigned * p0, unsigned * p1, int nWords )
{
    int w;
    if ( (p0[0] & 1) == (p1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                return 0;
        return 1;
    }
}